

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demangle_rust.cc
# Opt level: O0

bool __thiscall
absl::debugging_internal::anon_unknown_0::RustSymbolParser::Emit(RustSymbolParser *this,char *token)

{
  size_t sVar1;
  char *in_RSI;
  long in_RDI;
  size_t bytes_to_copy;
  size_t token_length;
  undefined1 local_1;
  
  if (*(int *)(in_RDI + 0x18c) < 1) {
    sVar1 = strlen(in_RSI);
    if ((ulong)(*(long *)(in_RDI + 0x1a8) - *(long *)(in_RDI + 0x1a0)) < sVar1 + 1) {
      local_1 = false;
    }
    else {
      memcpy(*(void **)(in_RDI + 0x1a0),in_RSI,sVar1 + 1);
      *(size_t *)(in_RDI + 0x1a0) = sVar1 + *(long *)(in_RDI + 0x1a0);
      local_1 = true;
    }
  }
  else {
    local_1 = true;
  }
  return local_1;
}

Assistant:

ABSL_MUST_USE_RESULT bool Emit(const char* token) {
    if (silence_depth_ > 0) return true;
    const size_t token_length = std::strlen(token);
    const size_t bytes_to_copy = token_length + 1;  // token and final NUL
    if (static_cast<size_t>(out_end_ - out_) < bytes_to_copy) return false;
    std::memcpy(out_, token, bytes_to_copy);
    out_ += token_length;
    return true;
  }